

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

int __thiscall FStateDefinitions::AddStates(FStateDefinitions *this,FState *state,char *framechars)

{
  bool bVar1;
  uint uVar2;
  FState *pFVar3;
  int local_44;
  char local_2d;
  int local_2c;
  int iStack_28;
  bool noframe;
  int count;
  int frame;
  bool error;
  char *framechars_local;
  FState *state_local;
  FStateDefinitions *this_local;
  
  bVar1 = false;
  iStack_28 = 0;
  local_2c = 0;
  _frame = framechars;
  while (*_frame != '\0') {
    local_2d = '\0';
    if (*_frame == '#') {
      local_2d = '\x01';
    }
    else if (*_frame == '^') {
      iStack_28 = 0x1b;
    }
    else {
      iStack_28 = ((int)*_frame & 0xdfU) - 0x41;
    }
    _frame = _frame + 1;
    if ((iStack_28 < 0) || (0x1c < iStack_28)) {
      iStack_28 = 0;
      bVar1 = true;
    }
    state->Frame = (BYTE)iStack_28;
    state->field_0x22 = state->field_0x22 & 0xfd | local_2d << 1;
    TArray<FState,_FState>::Push(&this->StateArray,state);
    local_2c = local_2c + 1;
    state->field_0x22 = state->field_0x22 & 0xf7;
  }
  uVar2 = TArray<FState,_FState>::Size(&this->StateArray);
  pFVar3 = TArray<FState,_FState>::operator[](&this->StateArray,(ulong)(uVar2 - 1));
  this->laststate = pFVar3;
  this->laststatebeforelabel = this->laststate;
  if (bVar1) {
    local_44 = -local_2c;
  }
  else {
    local_44 = local_2c;
  }
  return local_44;
}

Assistant:

int FStateDefinitions::AddStates(FState *state, const char *framechars)
{
	bool error = false;
	int frame = 0;
	int count = 0;
	while (*framechars)
	{
		bool noframe = false;

		if (*framechars == '#')
			noframe = true;
		else if (*framechars == '^') 
			frame = '\\' - 'A';
		else 
			frame = (*framechars & 223) - 'A';

		framechars++;
		if (frame < 0 || frame > 28)
		{
			frame = 0;
			error = true;
		}

		state->Frame = frame;
		state->SameFrame = noframe;
		StateArray.Push(*state);
		++count;

		// NODELAY flag is not carried past the first state
		state->NoDelay = false;
	}
	laststate = &StateArray[StateArray.Size() - 1];
	laststatebeforelabel = laststate;
	return !error ? count : -count;
}